

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
          (iuCartesianProductHolder *this)

{
  iuCartesianProductGenerator<bool,_int,_int> *this_00;
  _MyTuple *dst;
  iuCartesianProductGenerator<bool,_int,_int> *p;
  iuCartesianProductHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuValueArray<int,_int>,_iutest::detail::iuParamGenerator<int>_>
  *this_local;
  
  this_00 = (iuCartesianProductGenerator<bool,_int,_int> *)operator_new(0x38);
  iuCartesianProductGenerator<bool,_int,_int>::iuCartesianProductGenerator(this_00);
  dst = iuCartesianProductGenerator<bool,_int,_int>::generators(this_00);
  tuples::
  tuple_cast_copy<std::tuple<iutest::detail::iuParamGenerator<bool>,iutest::detail::iuParamGenerator<int>,iutest::detail::iuParamGenerator<int>>,std::tuple<iutest::detail::iuParamGenerator<bool>const,iutest::detail::iuValueArray<int,int>const,iutest::detail::iuParamGenerator<int>const>>
            (dst,(tuple<const_iutest::detail::iuParamGenerator<bool>,_const_iutest::detail::iuValueArray<int,_int>,_const_iutest::detail::iuParamGenerator<int>_>
                  *)this);
  return &this_00->super_iuIParamGenerator<std::tuple<bool,_int,_int>_>;
}

Assistant:

operator iuIParamGenerator< tuples::tuple<Args...> >* () const
    {
        iuCartesianProductGenerator<Args...>* p = new iuCartesianProductGenerator<Args...>();
        tuples::tuple_cast_copy(p->generators(), v);
        return p;
    }